

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentEditor.cpp
# Opt level: O2

void __thiscall
InstrumentEditor::InstrumentEditor
          (InstrumentEditor *this,Module *mod,InstrumentListModel *model,
          WaveListModel *waveListModel,PianoInput *input,QWidget *parent)

{
  QComboBox **ppQVar1;
  QGroupBox *this_00;
  QVBoxLayout *pQVar2;
  QComboBox *pQVar3;
  QCheckBox *pQVar4;
  QGroupBox *pQVar5;
  EnvelopeForm *this_01;
  QHBoxLayout *pQVar6;
  QPushButton *pQVar7;
  QTabWidget *this_02;
  QWidget *pQVar8;
  SequenceEditor *pSVar9;
  undefined4 *puVar10;
  size_t i;
  long lVar11;
  size_t sequenceIndex;
  initializer_list<QString> args;
  undefined8 in_stack_ffffffffffffff18;
  uint uVar14;
  int *piVar12;
  ulong uVar13;
  QArrayDataPointer<char16_t> local_d0;
  QString local_b8;
  QString local_a0;
  QString local_88;
  undefined1 local_70 [16];
  Object local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QArrayDataPointer<QString> local_48;
  
  BaseEditor::BaseEditor(&this->super_BaseEditor,&model->super_BaseTableModel,input,parent);
  *(undefined ***)&(this->super_BaseEditor).super_PersistantDialog = &PTR_metaObject_001f33d0;
  *(undefined ***)&(this->super_BaseEditor).super_PersistantDialog.field_0x10 =
       &PTR__InstrumentEditor_001f35b0;
  this->mModule = mod;
  this->mWaveListModel = waveListModel;
  this->mChannelCombo = (QComboBox *)0x0;
  this->mSetEnvelopeCheck = (QCheckBox *)0x0;
  this->mEnvelopeGroup = (QGroupBox *)0x0;
  this->mEnvelopeForm = (EnvelopeForm *)0x0;
  this->mWaveformGroup = (QGroupBox *)0x0;
  this->mWaveformCombo = (QComboBox *)0x0;
  this->mWaveformEditButton = (QPushButton *)0x0;
  this->mSequenceTabs = (QTabWidget *)0x0;
  (this->mSequenceEditors)._M_elems[0] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[1] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[2] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[3] = (SequenceEditor *)0x0;
  (this->mInstrument).super___shared_ptr<trackerboy::Instrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->mInstrument).super___shared_ptr<trackerboy::Instrument,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mCanEdit = true;
  tr((QString *)&local_d0,"Instrument editor",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  this_00 = (QGroupBox *)operator_new(0x28);
  tr((QString *)&local_d0,"Channel",(char *)0x0,-1);
  QGroupBox::QGroupBox(this_00,(QString *)&local_d0,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  pQVar2 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar2);
  pQVar3 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar3,(QWidget *)0x0);
  ppQVar1 = &this->mChannelCombo;
  *ppQVar1 = pQVar3;
  pQVar4 = (QCheckBox *)operator_new(0x28);
  tr((QString *)&local_d0,"Set volume on trigger",(char *)0x0,-1);
  QCheckBox::QCheckBox(pQVar4,(QString *)&local_d0,(QWidget *)0x0);
  this->mSetEnvelopeCheck = pQVar4;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  QBoxLayout::addWidget(pQVar2,this->mChannelCombo,0,0);
  QBoxLayout::addWidget(pQVar2,this->mSetEnvelopeCheck,0,0);
  QBoxLayout::addStretch((int)pQVar2);
  QWidget::setLayout((QLayout *)this_00);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  tr((QString *)&local_d0,"Volume envelope",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar5,(QString *)&local_d0,(QWidget *)0x0);
  this->mEnvelopeGroup = pQVar5;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  pQVar2 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar2);
  this_01 = (EnvelopeForm *)operator_new(0x140);
  EnvelopeForm::EnvelopeForm(this_01,(QWidget *)0x0);
  this->mEnvelopeForm = this_01;
  QBoxLayout::addWidget(pQVar2,this_01,0);
  QBoxLayout::addStretch((int)pQVar2);
  QLayout::setContentsMargins((int)pQVar2,0,0,0);
  QWidget::setLayout((QLayout *)this->mEnvelopeGroup);
  pQVar5 = (QGroupBox *)operator_new(0x28);
  tr((QString *)&local_d0,"Waveform",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar5,(QString *)&local_d0,(QWidget *)0x0);
  this->mWaveformGroup = pQVar5;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  pQVar6 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar6);
  pQVar3 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar3,(QWidget *)0x0);
  this->mWaveformCombo = pQVar3;
  (**(code **)(*(long *)pQVar3 + 0x1a0))(pQVar3,this->mWaveListModel);
  pQVar7 = (QPushButton *)operator_new(0x28);
  tr((QString *)&local_d0,"Edit",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar7,(QString *)&local_d0,(QWidget *)0x0);
  this->mWaveformEditButton = pQVar7;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  QPushButton::setAutoDefault(SUB81(this->mWaveformEditButton,0));
  QPushButton::setDefault(SUB81(this->mWaveformEditButton,0));
  QBoxLayout::addWidget(pQVar6,this->mWaveformCombo,1);
  QBoxLayout::addWidget(pQVar6,this->mWaveformEditButton,0);
  QLayoutItem::setAlignment(pQVar6 + 0x10,0x20);
  QWidget::setLayout((QLayout *)this->mWaveformGroup);
  this_02 = (QTabWidget *)operator_new(0x28);
  QTabWidget::QTabWidget(this_02,(QWidget *)0x0);
  this->mSequenceTabs = this_02;
  pQVar2 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar2);
  pQVar6 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar6);
  QBoxLayout::addWidget(pQVar6,this_00,0);
  QBoxLayout::addWidget(pQVar6,this->mEnvelopeGroup,1);
  QBoxLayout::addWidget(pQVar6,this->mWaveformGroup,1);
  QBoxLayout::addLayout((QLayout *)pQVar2,(int)pQVar6);
  QBoxLayout::addWidget(pQVar2,this->mSequenceTabs,1);
  QLayout::setContentsMargins((int)pQVar2,0,0,0);
  pQVar8 = BaseEditor::editorWidget(&this->super_BaseEditor);
  QWidget::setLayout((QLayout *)pQVar8);
  QWidget::hide();
  QWidget::setEnabled(SUB81(this->mWaveformGroup,0));
  QWidget::setEnabled(SUB81(this->mEnvelopeGroup,0));
  pQVar3 = *ppQVar1;
  tr((QString *)&local_d0,"CH1 - Duty",(char *)0x0,-1);
  tr(&local_b8,"CH2 - Duty",(char *)0x0,-1);
  tr(&local_a0,"CH3 - Wave",(char *)0x0,-1);
  tr(&local_88,"CH4 - Noise",(char *)0x0,-1);
  args._M_len = 4;
  args._M_array = (iterator)&local_d0;
  QList<QString>::QList((QList<QString> *)&local_48,args);
  QComboBox::addItems(pQVar3,(QStringList *)&local_48);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  lVar11 = 0x48;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)((long)&local_d0.d + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  for (sequenceIndex = 0; uVar14 = (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20),
      sequenceIndex != 4; sequenceIndex = sequenceIndex + 1) {
    pSVar9 = (SequenceEditor *)operator_new(0x50);
    SequenceEditor::SequenceEditor(pSVar9,mod,sequenceIndex,(QWidget *)0x0);
    (this->mSequenceEditors)._M_elems[sequenceIndex] = pSVar9;
  }
  pQVar8 = (QWidget *)this->mSequenceTabs;
  pSVar9 = (this->mSequenceEditors)._M_elems[0];
  tr((QString *)&local_d0,"Arpeggio",(char *)0x0,-1);
  QTabWidget::addTab(pQVar8,(QString *)pSVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  pQVar8 = (QWidget *)this->mSequenceTabs;
  pSVar9 = (this->mSequenceEditors)._M_elems[1];
  tr((QString *)&local_d0,"Panning",(char *)0x0,-1);
  QTabWidget::addTab(pQVar8,(QString *)pSVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  pQVar8 = (QWidget *)this->mSequenceTabs;
  pSVar9 = (this->mSequenceEditors)._M_elems[2];
  tr((QString *)&local_d0,"Pitch",(char *)0x0,-1);
  QTabWidget::addTab(pQVar8,(QString *)pSVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  pQVar8 = (QWidget *)this->mSequenceTabs;
  pSVar9 = (this->mSequenceEditors)._M_elems[3];
  tr((QString *)&local_d0,"Duty cycle",(char *)0x0,-1);
  QTabWidget::addTab(pQVar8,(QString *)pSVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  pQVar4 = this->mSetEnvelopeCheck;
  local_d0.d = (Data *)QAbstractButton::toggled;
  local_d0.ptr = (char16_t *)0x0;
  puVar10 = (undefined4 *)operator_new(0x18);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/editors/InstrumentEditor.cpp:114:9),_1,_QtPrivate::List<bool>,_void>
       ::impl;
  *(InstrumentEditor **)(puVar10 + 4) = this;
  piVar12 = (int *)((ulong)uVar14 << 0x20);
  QObject::connectImpl
            (local_50,(void **)pQVar4,(QObject *)&local_d0,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar10,piVar12,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pQVar3 = *ppQVar1;
  local_d0.d = (Data *)QComboBox::currentIndexChanged;
  local_d0.ptr = (char16_t *)0x0;
  puVar10 = (undefined4 *)operator_new(0x18);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/editors/InstrumentEditor.cpp:121:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(InstrumentEditor **)(puVar10 + 4) = this;
  QObject::connectImpl
            (local_58,(void **)pQVar3,(QObject *)&local_d0,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar10,(int *)((ulong)piVar12 & 0xffffffff00000000),(QMetaObject *)0x0
            );
  QMetaObject::Connection::~Connection((Connection *)local_58);
  local_d0.d = (Data *)setEnvelopeToWaveform;
  local_d0.ptr = (char16_t *)0x0;
  uVar13 = 0;
  QObject::connect<void(QComboBox::*)(int),void(InstrumentEditor::*)(int)>
            (local_60,(offset_in_QComboBox_to_subr)this->mWaveformCombo,
             (Object *)QComboBox::currentIndexChanged,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pQVar7 = this->mWaveformEditButton;
  local_d0.d = (Data *)QAbstractButton::clicked;
  local_d0.ptr = (char16_t *)0x0;
  puVar10 = (undefined4 *)operator_new(0x18);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/editors/InstrumentEditor.cpp:158:9),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(InstrumentEditor **)(puVar10 + 4) = this;
  QObject::connectImpl
            ((QObject *)(local_70 + 8),(void **)pQVar7,(QObject *)&local_d0,(void **)this,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar10,(int *)(uVar13 & 0xffffffff00000000),
             (QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)(local_70 + 8));
  local_d0.d = (Data *)setEnvelope;
  local_d0.ptr = (char16_t *)0x0;
  QObject::connect<void(EnvelopeForm::*)(unsigned_char),void(InstrumentEditor::*)(unsigned_char)>
            ((Object *)local_70,(offset_in_EnvelopeForm_to_subr)this->mEnvelopeForm,
             (Object *)EnvelopeForm::envelopeChanged,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  return;
}

Assistant:

InstrumentEditor::InstrumentEditor(
    Module &mod,
    InstrumentListModel &model,
    WaveListModel &waveListModel,
    PianoInput const& input,
    QWidget *parent
) :
    BaseEditor(model, input, parent),
    mModule(mod),
    mWaveListModel(waveListModel),
    mChannelCombo(nullptr),
    mSetEnvelopeCheck(nullptr),
    mEnvelopeGroup(nullptr),
    mEnvelopeForm(nullptr),
    mWaveformGroup(nullptr),
    mWaveformCombo(nullptr),
    mWaveformEditButton(nullptr),
    mSequenceTabs(nullptr),
    mSequenceEditors(),
    mInstrument(nullptr),
    mCanEdit(true)
{
    setWindowTitle(tr("Instrument editor"));
    auto channelGroup = new QGroupBox(tr("Channel"));
    {
        auto layout = new QVBoxLayout;
        mChannelCombo = new QComboBox;
        mSetEnvelopeCheck = new QCheckBox(tr(TU::SET_VOLUME_CHECK_STR));
        layout->addWidget(mChannelCombo);
        layout->addWidget(mSetEnvelopeCheck);
        layout->addStretch();
        channelGroup->setLayout(layout);
    }

    mEnvelopeGroup = new QGroupBox(tr("Volume envelope"));
    {
        auto layout = new QVBoxLayout;
        mEnvelopeForm = new EnvelopeForm;
        layout->addWidget(mEnvelopeForm);
        layout->addStretch();
        layout->setContentsMargins(0, 0, 0, 0);
        mEnvelopeGroup->setLayout(layout);
    }

    mWaveformGroup = new QGroupBox(tr("Waveform"));
    {
        auto layout = new QHBoxLayout;
        mWaveformCombo = new QComboBox;
        mWaveformCombo->setModel(&mWaveListModel);
        mWaveformEditButton = new QPushButton(tr("Edit"));
        mWaveformEditButton->setAutoDefault(false);
        mWaveformEditButton->setDefault(false);
        layout->addWidget(mWaveformCombo, 1);
        layout->addWidget(mWaveformEditButton);
        layout->setAlignment(Qt::AlignTop);
        mWaveformGroup->setLayout(layout);

        
    }

    mSequenceTabs = new QTabWidget;

    auto layout = new QVBoxLayout;
    auto settingsLayout = new QHBoxLayout;
    settingsLayout->addWidget(channelGroup);
    settingsLayout->addWidget(mEnvelopeGroup, 1);
    settingsLayout->addWidget(mWaveformGroup, 1);
    layout->addLayout(settingsLayout);
    layout->addWidget(mSequenceTabs, 1);
    layout->setContentsMargins(0, 0, 0, 0);
    editorWidget()->setLayout(layout);
    
    mWaveformGroup->hide();
    mWaveformGroup->setEnabled(false);
    mEnvelopeGroup->setEnabled(false);
    
    mChannelCombo->addItems({
        tr("CH1 - Duty"),
        tr("CH2 - Duty"),
        tr("CH3 - Wave"),
        tr("CH4 - Noise")
    });

    for (size_t i = 0; i < trackerboy::Instrument::SEQUENCE_COUNT; ++i) {
        mSequenceEditors[i] = new SequenceEditor(mod, i);
    }
    

    mSequenceTabs->addTab(mSequenceEditors[0], tr("Arpeggio"));
    mSequenceTabs->addTab(mSequenceEditors[1], tr("Panning"));
    mSequenceTabs->addTab(mSequenceEditors[2], tr("Pitch"));
    mSequenceTabs->addTab(mSequenceEditors[3], tr(TU::DUTY_CYCLE_STR));
    

    connect(mSetEnvelopeCheck, &QCheckBox::toggled, this,
        [this](bool checked) {
            mEnvelopeGroup->setEnabled(checked);
            mWaveformGroup->setEnabled(checked);
            setEnvelopeEnable(checked);
        });

    connect(mChannelCombo, qOverload<int>(&QComboBox::currentIndexChanged), this,
        [this](int index) {
            if (index == -1) {
                return;
            }
            setChannel(index);
            
            auto const isWave = index == 2;
            mWaveformGroup->setVisible(isWave);
            mEnvelopeGroup->setVisible(!isWave);

            switch (index) {
                case 0:
                case 1:
                    mSequenceTabs->setTabText(3, tr(TU::DUTY_CYCLE_STR));
                    break;
                case 2:
                    mSequenceTabs->setTabText(3, tr("Volume"));
                    break;
                case 3:
                    mSequenceTabs->setTabText(3, tr("Noise"));
                    break;
            }

            if (isWave) {
                setEnvelopeToWaveform(mWaveformCombo->currentIndex());
                mSetEnvelopeCheck->setText(tr(TU::SET_WAVE_CHECK_STR));
            } else {
                setEnvelope(mEnvelopeForm->envelope());
                mSetEnvelopeCheck->setText(tr(TU::SET_VOLUME_CHECK_STR));
            }

        });

    
    connect(mWaveformCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &InstrumentEditor::setEnvelopeToWaveform);

    connect(mWaveformEditButton, &QPushButton::clicked, this,
        [this]() {
            emit openWaveEditor(mWaveformCombo->currentIndex());
        });

    connect(mEnvelopeForm, &EnvelopeForm::envelopeChanged, this, &InstrumentEditor::setEnvelope);

}